

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int>::on_num
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int> *this)

{
  char *pcVar1;
  char cVar2;
  byte bVar3;
  ushort uVar4;
  basic_format_specs<char> *pbVar5;
  bool bVar6;
  bool bVar7;
  char cVar8;
  uint uVar9;
  buffer_appender<char> bVar10;
  uint uVar11;
  int iVar12;
  char *pcVar13;
  ulong uVar14;
  buffer<char> *buf;
  uint uVar15;
  uint uVar16;
  _Alloc_hider _Var17;
  ulong uVar18;
  uint uVar19;
  int iVar20;
  size_type sVar21;
  uint uVar22;
  ulong size;
  string groups;
  char digits [40];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  string local_2a8;
  int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int> *local_288;
  char *local_280;
  char local_278 [48];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_248;
  
  grouping_impl<char>(&local_2a8,(locale_ref)(this->locale).locale_);
  if (local_2a8._M_string_length == 0) {
    on_dec(this);
    goto LAB_003c0cd0;
  }
  cVar8 = thousands_sep_impl<char>((locale_ref)(this->locale).locale_);
  if (cVar8 == '\0') {
    on_dec(this);
    goto LAB_003c0cd0;
  }
  uVar16 = this->abs_value;
  uVar15 = 0x1f;
  if ((uVar16 | 1) != 0) {
    for (; (uVar16 | 1) >> uVar15 == 0; uVar15 = uVar15 - 1) {
    }
  }
  uVar4 = *(ushort *)(bsr2log10(int)::data + (ulong)uVar15 * 2);
  bVar7 = uVar16 < *(uint *)(basic_data<void>::zero_or_powers_of_10_32_new + (ulong)uVar4 * 4);
  uVar22 = (uint)uVar4 - (uint)bVar7;
  _Var17._M_p = local_2a8._M_dataplus._M_p;
  uVar15 = uVar22;
  uVar9 = uVar22;
  if (local_2a8._M_string_length == 0) {
LAB_003c0a96:
    uVar19 = uVar9;
    uVar11 = uVar15;
    if (_Var17._M_p == local_2a8._M_dataplus._M_p + local_2a8._M_string_length) goto LAB_003c0aa1;
  }
  else {
    uVar19 = uVar22 + (int)local_2a8._M_string_length;
    sVar21 = local_2a8._M_string_length;
    do {
      cVar2 = *_Var17._M_p;
      uVar11 = uVar15 - (int)cVar2;
      if ((uVar11 == 0 || (int)uVar15 < (int)cVar2) || ((byte)(cVar2 + 0x81U) < 0x82))
      goto LAB_003c0a96;
      uVar9 = uVar9 + 1;
      _Var17._M_p = _Var17._M_p + 1;
      sVar21 = sVar21 - 1;
      uVar15 = uVar11;
    } while (sVar21 != 0);
LAB_003c0aa1:
    uVar19 = (int)(uVar11 - 1) / (int)(local_2a8._M_dataplus._M_p + local_2a8._M_string_length)[-1]
             + uVar19;
  }
  pcVar13 = local_278 + (int)uVar22;
  uVar15 = uVar16;
  if (99 < uVar16) {
    do {
      uVar16 = uVar15 / 100;
      *(undefined2 *)(pcVar13 + -2) =
           *(undefined2 *)(basic_data<void>::digits + (ulong)(uVar15 % 100) * 2);
      pcVar13 = pcVar13 + -2;
      bVar6 = 9999 < uVar15;
      uVar15 = uVar15 / 100;
    } while (bVar6);
  }
  if (uVar16 < 10) {
    pcVar13[-1] = (byte)uVar16 | 0x30;
  }
  else {
    *(undefined2 *)(pcVar13 + -2) = *(undefined2 *)(basic_data<void>::digits + (ulong)uVar16 * 2);
  }
  local_248.super_buffer<char>.size_ = 0;
  local_248.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_008797a0;
  local_248.super_buffer<char>.ptr_ = local_248.store_;
  local_248.super_buffer<char>.capacity_ = 500;
  uVar19 = uVar19 + this->prefix_size;
  if (-1 < (int)uVar19) {
    size = (ulong)uVar19;
    if (500 < uVar19) {
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow(&local_248,size);
    }
    local_248.super_buffer<char>.size_ = local_248.super_buffer<char>.capacity_;
    if (size <= local_248.super_buffer<char>.capacity_) {
      local_248.super_buffer<char>.size_ = size;
    }
    pcVar13 = local_248.super_buffer<char>.ptr_ + (size - 1);
    if (1 < (int)uVar22) {
      uVar18 = (ulong)uVar22;
      iVar20 = ((uint)uVar4 - (uint)bVar7) + 1;
      iVar12 = 0;
      _Var17._M_p = local_2a8._M_dataplus._M_p;
      do {
        uVar18 = uVar18 - 1;
        pcVar1 = pcVar13 + -1;
        *pcVar13 = local_278[uVar18 & 0xffffffff];
        cVar2 = *_Var17._M_p;
        if (0 < cVar2) {
          iVar12 = iVar12 + 1;
          if ((cVar2 != '\x7f') && (iVar12 % (int)cVar2 == 0)) {
            if (_Var17._M_p + 1 != local_2a8._M_dataplus._M_p + local_2a8._M_string_length) {
              iVar12 = 0;
              _Var17._M_p = _Var17._M_p + 1;
            }
            pcVar13[-1] = cVar8;
            pcVar1 = pcVar13 + -2;
          }
        }
        pcVar13 = pcVar1;
        iVar20 = iVar20 + -1;
      } while (2 < iVar20);
    }
    *pcVar13 = local_278[0];
    if (this->prefix_size != 0) {
      pcVar13[-1] = '-';
    }
    pbVar5 = this->specs;
    uVar18 = (ulong)pbVar5->width;
    if (-1 < (long)uVar18) {
      local_280 = local_248.super_buffer<char>.ptr_;
      uVar14 = 0;
      if (size <= uVar18) {
        uVar14 = uVar18 - size;
      }
      bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
           (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
      bVar3 = *(byte *)((long)&basic_data<void>::right_padding_shifts +
                       (ulong)((byte)pbVar5->field_0x9 & 0xf));
      local_288 = this;
      if (*(ulong *)((long)bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                           container + 0x18) <
          *(long *)((long)bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                          container + 0x10) + size + (pbVar5->fill).size_ * uVar14) {
        (*(code *)**(undefined8 **)
                    bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                  (bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
      }
      uVar18 = uVar14 >> (bVar3 & 0x3f);
      bVar10 = fill<fmt::v7::detail::buffer_appender<char>,char>(bVar10,uVar18,&pbVar5->fill);
      bVar10 = std::__copy_move<false,false,std::random_access_iterator_tag>::
               __copy_m<char*,fmt::v7::detail::buffer_appender<char>>
                         (local_280,local_280 + size,bVar10);
      bVar10 = fill<fmt::v7::detail::buffer_appender<char>,char>
                         (bVar10,uVar14 - uVar18,&pbVar5->fill);
      (local_288->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (buffer<char> *)
           bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
      if (local_248.super_buffer<char>.ptr_ != local_248.store_) {
        operator_delete(local_248.super_buffer<char>.ptr_,local_248.super_buffer<char>.capacity_);
      }
LAB_003c0cd0:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
      }
      return;
    }
  }
  assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/include/fmt/core.h"
              ,0x146,"negative value");
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits, n = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && n > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      n -= *group;
      ++group;
    }
    if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
    char digits[40];
    format_decimal(digits, abs_value, num_digits);
    basic_memory_buffer<Char> buffer;
    size += static_cast<int>(prefix_size);
    const auto usize = to_unsigned(size);
    buffer.resize(usize);
    basic_string_view<Char> s(&sep, sep_size);
    // Index of a decimal digit with the least significant digit having index 0.
    int digit_index = 0;
    group = groups.cbegin();
    auto p = buffer.data() + size - 1;
    for (int i = num_digits - 1; i > 0; --i) {
      *p-- = static_cast<Char>(digits[i]);
      if (*group <= 0 || ++digit_index % *group != 0 ||
          *group == max_value<char>())
        continue;
      if (group + 1 != groups.cend()) {
        digit_index = 0;
        ++group;
      }
      std::uninitialized_copy(s.data(), s.data() + s.size(),
                              make_checked(p, s.size()));
      p -= s.size();
    }
    *p-- = static_cast<Char>(*digits);
    if (prefix_size != 0) *p = static_cast<Char>('-');
    auto data = buffer.data();
    out = write_padded<align::right>(
        out, specs, usize, usize,
        [=](iterator it) { return copy_str<Char>(data, data + size, it); });
  }